

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_ext.cpp
# Opt level: O1

void ucnv_extContinueMatchFromU_63
               (UConverter *cnv,UConverterFromUnicodeArgs *pArgs,int32_t srcIndex,
               UErrorCode *pErrorCode)

{
  UChar *pre;
  UChar UVar1;
  UChar32 firstCP;
  int32_t *piVar2;
  bool bVar3;
  int32_t iVar4;
  uint uVar5;
  char *bytes;
  long lVar6;
  uint32_t uVar7;
  int iVar8;
  char *pcVar9;
  undefined4 in_register_00000014;
  char cVar10;
  int preLength;
  UChar *s;
  UChar *src;
  uint32_t value;
  UErrorCode *local_68;
  undefined8 local_60;
  char local_58;
  char local_57 [39];
  
  local_60 = CONCAT44(in_register_00000014,srcIndex);
  value = 0;
  firstCP = cnv->preFromUFirstCP;
  pre = cnv->preFromU;
  cVar10 = cnv->preFromULength;
  preLength = (int)cVar10;
  src = pArgs->source;
  local_68 = pErrorCode;
  iVar4 = ucnv_extMatchFromU((cnv->sharedData->mbcs).extIndexes,firstCP,pre,preLength,src,
                             (int32_t)((ulong)((long)pArgs->sourceLimit - (long)src) >> 1),&value,
                             cnv->useFallback,pArgs->flush);
  if (iVar4 < 2) {
    if (-1 < iVar4) {
      if (iVar4 == 1) {
        cnv->useSubChar1 = '\x01';
      }
      cnv->fromUChar32 = firstCP;
      cnv->preFromUFirstCP = -1;
      cnv->preFromULength = -cVar10;
      *local_68 = U_INVALID_CHAR_FOUND;
      return;
    }
    iVar8 = -2 - iVar4;
    if (preLength < iVar8) {
      lVar6 = (long)preLength;
      do {
        UVar1 = *src;
        src = src + 1;
        pre[lVar6] = UVar1;
        lVar6 = lVar6 + 1;
      } while (iVar8 != lVar6);
    }
    pArgs->source = src;
    cnv->preFromULength = (int8_t)iVar8;
    return;
  }
  uVar5 = iVar4 - 2;
  if ((int)uVar5 < preLength) {
    u_memmove_63(pre,pre + uVar5,preLength - uVar5);
    cVar10 = -(char)(preLength - uVar5);
  }
  else {
    pArgs->source = src + (int)(uVar5 - preLength);
    cVar10 = '\0';
  }
  cnv->preFromULength = cVar10;
  cnv->preFromUFirstCP = -1;
  uVar5 = value >> 0x18 & 0x1f;
  if (uVar5 < 4) {
    bytes = local_57;
    pcVar9 = bytes;
    if (uVar5 != 1) {
      if (uVar5 != 2) {
        if (uVar5 != 3) goto LAB_00397663;
        pcVar9 = local_57 + 1;
        local_57[0] = (char)(value >> 0x10);
      }
      *pcVar9 = (char)(value >> 8);
      pcVar9 = pcVar9 + 1;
    }
    *pcVar9 = (char)value;
  }
  else {
    piVar2 = (cnv->sharedData->mbcs).extIndexes;
    bytes = (char *)((long)piVar2 + (long)piVar2[8] + (ulong)(value & 0xffffff));
  }
LAB_00397663:
  pcVar9 = pArgs->targetLimit;
  uVar7 = cnv->fromUnicodeStatus;
  if (uVar7 == 0) goto LAB_0039770b;
  if (uVar5 == 1 && 1 < (int)uVar7) {
    cVar10 = '\x0f';
    uVar7 = 1;
LAB_003976df:
    cnv->fromUnicodeStatus = uVar7;
    bVar3 = false;
  }
  else {
    if (1 < uVar5 && uVar7 == 1) {
      cVar10 = '\x0e';
      uVar7 = 2;
      goto LAB_003976df;
    }
    bVar3 = true;
    cVar10 = '\0';
  }
  if (!bVar3) {
    local_58 = cVar10;
    if (bytes != local_57) {
      memcpy(local_57,bytes,(ulong)uVar5);
    }
    uVar5 = uVar5 + 1;
    bytes = &local_58;
  }
LAB_0039770b:
  ucnv_fromUWriteBytes_63
            (cnv,bytes,uVar5,&pArgs->target,pcVar9,&pArgs->offsets,(int32_t)local_60,local_68);
  return;
}

Assistant:

U_CFUNC void
ucnv_extContinueMatchFromU(UConverter *cnv,
                           UConverterFromUnicodeArgs *pArgs, int32_t srcIndex,
                           UErrorCode *pErrorCode) {
    uint32_t value = 0;  /* initialize output-only param to 0 to silence gcc */
    int32_t match;

    match=ucnv_extMatchFromU(cnv->sharedData->mbcs.extIndexes,
                             cnv->preFromUFirstCP,
                             cnv->preFromU, cnv->preFromULength,
                             pArgs->source, (int32_t)(pArgs->sourceLimit-pArgs->source),
                             &value,
                             cnv->useFallback, pArgs->flush);
    if(match>=2) {
        match-=2; /* remove 2 for the initial code point */

        if(match>=cnv->preFromULength) {
            /* advance src pointer for the consumed input */
            pArgs->source+=match-cnv->preFromULength;
            cnv->preFromULength=0;
        } else {
            /* the match did not use all of preFromU[] - keep the rest for replay */
            int32_t length=cnv->preFromULength-match;
            u_memmove(cnv->preFromU, cnv->preFromU+match, length);
            cnv->preFromULength=(int8_t)-length;
        }

        /* finish the partial match */
        cnv->preFromUFirstCP=U_SENTINEL;

        /* write result */
        ucnv_extWriteFromU(cnv, cnv->sharedData->mbcs.extIndexes,
                           value,
                           &pArgs->target, pArgs->targetLimit,
                           &pArgs->offsets, srcIndex,
                           pErrorCode);
    } else if(match<0) {
        /* save state for partial match */
        const UChar *s;
        int32_t j;

        /* just _append_ the newly consumed input to preFromU[] */
        s=pArgs->source;
        match=-match-2; /* remove 2 for the initial code point */
        for(j=cnv->preFromULength; j<match; ++j) {
            U_ASSERT(j>=0);
            cnv->preFromU[j]=*s++;
        }
        pArgs->source=s; /* same as *src=srcLimit; because we reached the end of input */
        cnv->preFromULength=(int8_t)match;
    } else /* match==0 or 1 */ {
        /*
         * no match
         *
         * We need to split the previous input into two parts:
         *
         * 1. The first code point is unmappable - that's how we got into
         *    trying the extension data in the first place.
         *    We need to move it from the preFromU buffer
         *    to the error buffer, set an error code,
         *    and prepare the rest of the previous input for 2.
         *
         * 2. The rest of the previous input must be converted once we
         *    come back from the callback for the first code point.
         *    At that time, we have to try again from scratch to convert
         *    these input characters.
         *    The replay will be handled by the ucnv.c conversion code.
         */

        if(match==1) {
            /* matched, no mapping but request for <subchar1> */
            cnv->useSubChar1=TRUE;
        }

        /* move the first code point to the error field */
        cnv->fromUChar32=cnv->preFromUFirstCP;
        cnv->preFromUFirstCP=U_SENTINEL;

        /* mark preFromU for replay */
        cnv->preFromULength=-cnv->preFromULength;

        /* set the error code for unassigned */
        *pErrorCode=U_INVALID_CHAR_FOUND;
    }
}